

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

Value * system_function_print(Value *context_value,TupleValue *parameter_values)

{
  Value *value;
  StringValue *string_value;
  size_t i;
  TupleValue *parameter_values_local;
  Value *context_value_local;
  
  if (parameter_values->length == 0) {
    context_value_local = new_null_value();
  }
  else {
    for (string_value = (StringValue *)0x0; string_value < (StringValue *)parameter_values->length;
        string_value = (StringValue *)((long)&(string_value->value).value_type + 1)) {
      value = convert_to_string_value(parameter_values->items[(long)string_value]);
      printf("%s",*(undefined8 *)(value + 1));
      if (string_value != (StringValue *)(parameter_values->length - 1)) {
        printf(" ");
      }
      free_value(value);
    }
    printf("\n");
    context_value_local = new_null_value();
  }
  return context_value_local;
}

Assistant:

Value *system_function_print(Value *context_value, TupleValue *parameter_values) {
  if (parameter_values->length == 0) {
    return new_null_value();
  }

  for (size_t i = 0; i < parameter_values->length; i++) {
    StringValue *string_value = (StringValue *) convert_to_string_value(parameter_values->items[i]);

    printf("%s", string_value->string_value);

    if (i != parameter_values->length - 1) {
      printf(" ");
    }

    free_value((Value *) string_value);
  }

  printf("\n");

  return new_null_value();
}